

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZTriangleTorus>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZTriangleTorus> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZTriangleTorus> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  bool bVar1;
  long lVar2;
  int64_t iVar3;
  long *plVar4;
  ostream *poVar5;
  mapped_type_conflict *pmVar6;
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  stringstream sout;
  size_t in_stack_00000168;
  char *in_stack_00000170;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd48;
  TPZAutoPointer<TPZRefPattern> *in_stack_fffffffffffffd50;
  mapped_type_conflict mVar7;
  long *in_stack_fffffffffffffd70;
  int64_t in_stack_fffffffffffffd78;
  TPZVec<long> *in_stack_fffffffffffffd80;
  ostream *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffd90;
  stringstream local_1e8 [16];
  ostream local_1d8 [80];
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffe78;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffe80;
  TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *in_stack_fffffffffffffe88;
  TPZGeoMesh *in_stack_fffffffffffffe90;
  void **in_stack_fffffffffffffe98;
  TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *in_stack_fffffffffffffea0;
  _Self local_60;
  _Self local_58;
  undefined8 local_50;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  long local_18;
  
  local_30 = 0;
  local_38 = 0x21;
  local_18 = in_RDX;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZTriangleTorus>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02460158);
  TPZGeoElRefLess<pzgeom::TPZTriangleTorus>::TPZGeoElRefLess
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0245fe30;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0245fe30;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x280));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            (in_stack_fffffffffffffd50,(TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffd48);
  TPZVec<long>::size((TPZVec<long> *)(local_18 + 0x280));
  local_50 = 0;
  TPZVec<long>::Resize
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  for (local_48 = 0; lVar2 = (long)local_48,
      iVar3 = TPZVec<long>::NElements((TPZVec<long> *)(local_18 + 0x280)), lVar2 < iVar3;
      local_48 = local_48 + 1) {
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_18 + 0x280),(long)local_48);
    if (*plVar4 == -1) {
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x280),(long)local_48);
      *plVar4 = -1;
    }
    else {
      TPZVec<long>::operator[]((TPZVec<long> *)(local_18 + 0x280),(long)local_48);
      local_58._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find(in_stack_fffffffffffffd48,(key_type_conflict1 *)0x172fec9);
      local_60._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     (in_stack_fffffffffffffd48);
      bVar1 = std::operator==(&local_58,&local_60);
      if (bVar1) {
        std::__cxx11::stringstream::stringstream(local_1e8);
        poVar5 = std::operator<<(local_1d8,"ERROR in - ");
        poVar5 = std::operator<<(poVar5,
                                 "TPZGeoElRefPattern<pzgeom::TPZTriangleTorus>::TPZGeoElRefPattern(TPZGeoMesh &, const TPZGeoElRefPattern<TGeo> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TGeo = pzgeom::TPZTriangleTorus]"
                                );
        poVar5 = std::operator<<(poVar5," subelement ");
        in_stack_fffffffffffffd90 = (ostream *)std::ostream::operator<<(poVar5,local_48);
        in_stack_fffffffffffffd88 = std::operator<<(in_stack_fffffffffffffd90," index = ");
        plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_18 + 0x280),(long)local_48);
        poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd88,*plVar4);
        std::operator<<(poVar5," is not in the map.");
        pzinternal::DebugStopImpl(in_stack_00000170,in_stack_00000168);
        std::__cxx11::stringstream::~stringstream(local_1e8);
      }
      TPZVec<long>::operator[]((TPZVec<long> *)(local_18 + 0x280),(long)local_48);
      pmVar6 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                             *)in_stack_fffffffffffffd90,
                            (key_type_conflict1 *)in_stack_fffffffffffffd88);
      mVar7 = *pmVar6;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x280),(long)local_48);
      *plVar4 = mVar7;
    }
  }
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh,
											 const TPZGeoElRefPattern<TGeo> &cp,
											 std::map<int64_t,int64_t> &gl2lcNdMap,
											 std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp,gl2lcNdMap,gl2lcElMap),
fRefPattern ( cp.fRefPattern )
{
	int i;
    this->fSubEl.Resize(cp.fSubEl.size(),0);
	for (i=0;i<cp.fSubEl.NElements();i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i] = -1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
			std::stringstream sout;
			sout << "ERROR in - " << __PRETTY_FUNCTION__
			<< " subelement " << i << " index = " << cp.fSubEl[i] << " is not in the map.";
#ifdef PZ_LOG
            TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
			LOGPZ_ERROR (loggerrefpattern,sout.str().c_str());
#endif
			DebugStop();
		}
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}